

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_match_expression_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_detection_rule_entry *pcVar3;
  char *__s1;
  char *path;
  char **ppcVar4;
  
  __s1 = *attr;
  if (__s1 == (char *)0x0) {
    path = (char *)0x0;
  }
  else {
    ppcVar4 = attr + 2;
    path = (char *)0x0;
    do {
      iVar2 = strcmp(__s1,"path");
      if (iVar2 == 0) {
        path = ppcVar4[-1];
        break;
      }
      __s1 = *ppcVar4;
      ppcVar4 = ppcVar4 + 2;
    } while (__s1 != (char *)0x0);
  }
  info->node->free_data = coda_detection_rule_entry_delete;
  pcVar3 = coda_detection_rule_entry_new(path);
  pnVar1 = info->node;
  pnVar1->data = pcVar3;
  if (pcVar3 == (coda_detection_rule_entry *)0x0) {
    iVar2 = -1;
  }
  else {
    pnVar1->expect_char_data = 1;
    pnVar1->finalise_element = cd_match_expression_finalise;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cd_match_expression_init(parser_info *info, const char **attr)
{
    const char *path;

    path = get_attribute_value(attr, "path");

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;
    info->node->data = coda_detection_rule_entry_new(path);
    if (info->node->data == NULL)
    {
        return -1;
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_expression_finalise;

    return 0;
}